

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_mask_b10_sx_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  blend_a64_mask_bn_sx_sy_w8n_sse4_1
            (dst,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,blend_8_b10);
  return;
}

Assistant:

static void blend_a64_mask_b10_sx_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sx_sy_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                     src1_stride, mask, mask_stride, w, h,
                                     blend_8_b10);
}